

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  NodePtr pSVar1;
  NodePtr pSVar2;
  int iVar3;
  undefined4 extraout_var;
  dag_iterator itr;
  SENode *local_e8;
  TreeDFIterator<spvtools::opt::SENode> local_e0;
  TreeDFIterator<spvtools::opt::SENode> local_88;
  long lVar4;
  
  TreeDFIterator<spvtools::opt::SENode>::TreeDFIterator(&local_e0,node);
  do {
    TreeDFIterator<spvtools::opt::SENode>::TreeDFIterator(&local_88);
    pSVar2 = local_88.current_;
    pSVar1 = local_e0.current_;
    std::
    _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                    *)&local_88.parent_iterators_);
    if (pSVar1 == pSVar2) {
LAB_0052a062:
      std::
      _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                      *)&local_e0.parent_iterators_);
      if (pSVar1 == pSVar2) {
        local_e8 = CreateConstant(this,0);
      }
      return local_e8;
    }
    iVar3 = (*(local_e0.current_)->_vptr_SENode[6])();
    lVar4 = CONCAT44(extraout_var,iVar3);
    if ((lVar4 != 0) && (*(Loop **)(lVar4 + 0x40) == loop)) {
      local_e8 = *(SENode **)(lVar4 + 0x30);
      goto LAB_0052a062;
    }
    TreeDFIterator<spvtools::opt::SENode>::MoveToNextNode(&local_e0);
  } while( true );
}

Assistant:

SENode* ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm(
    SENode* node, const Loop* loop) {
  // Traverse the DAG to find the recurrent expression belonging to |loop|.
  for (auto itr = node->graph_begin(); itr != node->graph_end(); ++itr) {
    SERecurrentNode* rec = itr->AsSERecurrentNode();
    if (rec && rec->GetLoop() == loop) {
      return rec->GetCoefficient();
    }
  }
  return CreateConstant(0);
}